

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int archive_read_format_rar_cleanup(archive_read *a)

{
  void *__ptr;
  
  __ptr = a->format->data;
  free_codes(a);
  free(*(void **)((long)__ptr + 0x48));
  free(*(void **)((long)__ptr + 0x50));
  free(*(void **)((long)__ptr + 0x100));
  free(*(void **)((long)__ptr + 0xe0));
  free(*(void **)((long)__ptr + 0x348));
  Ppmd7_Free((CPpmd7 *)((long)__ptr + 0x398),&g_szalloc);
  free(__ptr);
  a->format->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_read_format_rar_cleanup(struct archive_read *a)
{
  struct rar *rar;

  rar = (struct rar *)(a->format->data);
  free_codes(a);
  free(rar->filename);
  free(rar->filename_save);
  free(rar->dbo);
  free(rar->unp_buffer);
  free(rar->lzss.window);
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  free(rar);
  (a->format->data) = NULL;
  return (ARCHIVE_OK);
}